

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_section.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  bool bVar3;
  section *section;
  size_t sVar4;
  int iVar5;
  note_section_accessor note_writer;
  elfio reader;
  undefined1 local_e8 [32];
  pointer local_c8;
  string local_c0;
  elfio local_a0;
  
  if (argc == 2) {
    ELFIO::elfio::elfio(&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,argv[1],(allocator<char> *)&local_c0);
    bVar3 = ELFIO::elfio::load(&local_a0,(string *)local_e8,false);
    pcVar1 = local_e8 + 0x10;
    if ((pointer)local_e8._0_8_ != pcVar1) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if (bVar3) {
      local_e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,".note.ELFIO","");
      section = ELFIO::elfio::Sections::add(&local_a0.sections,(string *)local_e8);
      if ((pointer)local_e8._0_8_ != pcVar1) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
      (*section->_vptr_section[6])(section,&ELFIO::SHT_NOTE);
      ELFIO::note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
      note_section_accessor_template
                ((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> *)
                 local_e8,&local_a0,section);
      paVar2 = &local_c0.field_2;
      local_c0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Created by ELFIO","");
      ELFIO::note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::add_note
                ((note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size> *)
                 local_e8,1,&local_c0,"My data",8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_c0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"./result.elf","");
      ELFIO::elfio::save(&local_a0,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((void *)local_e8._16_8_ != (void *)0x0) {
        operator_delete((void *)local_e8._16_8_,(long)local_c8 - local_e8._16_8_);
      }
      iVar5 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Can\'t find or process ELF file ",0x1f);
      __s = argv[1];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x110120);
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      iVar5 = 2;
      std::ostream::flush();
    }
    ELFIO::elfio::~elfio(&local_a0);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: add_section <elf_file>",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 2 ) {
        std::cout << "Usage: add_section <elf_file>" << std::endl;
        return 1;
    }

    // Create an elfio reader
    elfio reader;

    // Load ELF data
    if ( !reader.load( argv[1] ) ) {
        std::cout << "Can't find or process ELF file " << argv[1] << std::endl;
        return 2;
    }

    // Create additional section at the end of the file
    section* note_sec = reader.sections.add( ".note.ELFIO" );
    note_sec->set_type( SHT_NOTE );
    note_section_accessor note_writer( reader, note_sec );
    note_writer.add_note( 0x01, "Created by ELFIO", "My data", 8 );

    reader.save( "./result.elf" );

    return 0;
}